

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Location.cpp
# Opt level: O3

Location *
psy::Location::create(Location *__return_storage_ptr__,FileLinePositionSpan *fileLineSpan)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  FileLinePositionSpan local_40;
  
  paVar2 = &local_40.path_.field_2;
  local_40.path_._M_dataplus._M_p = (fileLineSpan->path_)._M_dataplus._M_p;
  paVar1 = &(fileLineSpan->path_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.path_._M_dataplus._M_p == paVar1) {
    local_40.path_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_40.path_.field_2._8_8_ = *(undefined8 *)((long)&(fileLineSpan->path_).field_2 + 8);
    local_40.path_._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_40.path_.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_40.path_._M_string_length = (fileLineSpan->path_)._M_string_length;
  (fileLineSpan->path_)._M_dataplus._M_p = (pointer)paVar1;
  (fileLineSpan->path_)._M_string_length = 0;
  (fileLineSpan->path_).field_2._M_local_buf[0] = '\0';
  local_40.span_ = fileLineSpan->span_;
  local_40._33_7_ = *(undefined7 *)&fileLineSpan->field_0x21;
  local_40._40_8_ = *(undefined8 *)&fileLineSpan->field_0x28;
  Location(__return_storage_ptr__,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.path_._M_dataplus._M_p != paVar2) {
    operator_delete(local_40.path_._M_dataplus._M_p,local_40.path_.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

Location Location::create(FileLinePositionSpan fileLineSpan)
{
    return Location(std::move(fileLineSpan));
}